

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> __thiscall
capnp::SchemaLoader::Impl::makeBrandedDependencies
          (Impl *this,RawSchema *schema,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *bindings)

{
  ArrayDisposer **__return_storage_ptr__;
  Reader type;
  Reader type_00;
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  StringPtr scopeName_00;
  StringPtr scopeName_01;
  StringPtr scopeName_02;
  StringPtr scopeName_03;
  StringPtr scopeName_04;
  bool bVar1;
  Which WVar2;
  Which WVar3;
  uint uVar4;
  RawBrandedSchema *pRVar5;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *pAVar6;
  unsigned_long *puVar7;
  uint64_t uVar8;
  Dependency *pDVar9;
  Dependency *pDVar10;
  Reader RVar11;
  Range<unsigned_long> RVar12;
  ArrayPtr<capnp::_::RawBrandedSchema::Dependency> values;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar13;
  Dependency *slot_6;
  char *local_5e8;
  size_t sStack_5e0;
  Reader local_5d0;
  RawBrandedSchema *local_5a0;
  RawBrandedSchema *dep_6;
  Dependency *slot_5;
  char *local_578;
  size_t sStack_570;
  Reader local_560;
  RawBrandedSchema *local_530;
  RawBrandedSchema *dep_5;
  Reader method;
  unsigned_long i_2;
  Iterator __end3_2;
  Iterator __begin3_2;
  Range<unsigned_long> *__range3_2;
  Reader methods;
  Dependency *slot_4;
  char *local_478;
  size_t sStack_470;
  Reader local_468;
  RawBrandedSchema *local_438;
  RawBrandedSchema *dep_4;
  Reader superclass;
  unsigned_long i_1;
  Iterator __end3_1;
  Iterator __begin3_1;
  Range<unsigned_long> *__range3_1;
  Reader superclasses;
  Reader interface;
  Dependency *slot_3;
  RawBrandedSchema *dep_3;
  Dependency *slot_2;
  RawBrandedSchema *dep_2;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *b;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *_b1578;
  Reader local_320;
  RawSchema *local_2f0;
  RawSchema *group;
  Dependency *slot_1;
  char *local_2c8;
  size_t sStack_2c0;
  Reader local_2b0;
  Reader local_280;
  RawBrandedSchema *local_250;
  RawBrandedSchema *dep_1;
  Reader field;
  unsigned_long i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  undefined1 local_1b8 [8];
  Reader fields;
  Dependency *slot;
  char *local_168;
  size_t sStack_160;
  Reader local_150;
  Reader local_120;
  RawBrandedSchema *local_f0;
  RawBrandedSchema *dep;
  undefined1 local_d8 [8];
  Reader node;
  Vector<capnp::_::RawBrandedSchema::Dependency> deps;
  char *local_58;
  size_t sStack_50;
  StringPtr scopeName;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *bindings_local;
  RawSchema *schema_local;
  Impl *this_local;
  
  __return_storage_ptr__ = &deps.builder.disposer;
  readMessageUnchecked<capnp::schema::Node>((Reader *)__return_storage_ptr__,schema->encodedNode);
  RVar11 = capnp::schema::Node::Reader::getDisplayName((Reader *)__return_storage_ptr__);
  local_58 = RVar11.super_StringPtr.content.ptr;
  sStack_50 = RVar11.super_StringPtr.content.size_;
  kj::Vector<capnp::_::RawBrandedSchema::Dependency>::Vector
            ((Vector<capnp::_::RawBrandedSchema::Dependency> *)&node._reader.nestingLimit);
  readMessageUnchecked<capnp::schema::Node>((Reader *)local_d8,schema->encodedNode);
  WVar2 = capnp::schema::Node::Reader::which((Reader *)local_d8);
  switch(WVar2) {
  case FILE:
  case ENUM:
  case ANNOTATION:
    break;
  case STRUCT:
    capnp::schema::Node::Reader::getStruct((Reader *)&__range3,(Reader *)local_d8);
    capnp::schema::Node::Struct::Reader::getFields((Reader *)local_1b8,(Reader *)&__range3);
    RVar12 = kj::indices<capnp::List<capnp::schema::Field,(capnp::Kind)3>::Reader&>
                       ((Reader *)local_1b8);
    __begin3.value = RVar12.begin_;
    __end3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
    i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end3,(Iterator *)&i),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar7 = kj::Range<unsigned_long>::Iterator::operator*(&__end3);
      field._reader._40_8_ = *puVar7;
      List<capnp::schema::Field,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)&dep_1,(Reader *)local_1b8,field._reader.nestingLimit);
      WVar3 = capnp::schema::Field::Reader::which((Reader *)&dep_1);
      if (WVar3 == SLOT) {
        capnp::schema::Field::Reader::getSlot(&local_2b0,(Reader *)&dep_1);
        capnp::schema::Field::Slot::Reader::getType(&local_280,&local_2b0);
        local_2c8 = local_58;
        sStack_2c0 = sStack_50;
        kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
                  ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot_1,bindings
                  );
        scopeName_03.content.size_ = sStack_2c0;
        scopeName_03.content.ptr = local_2c8;
        type_00._reader.capTable = local_280._reader.capTable;
        type_00._reader.segment = local_280._reader.segment;
        type_00._reader.data = local_280._reader.data;
        type_00._reader.pointers = local_280._reader.pointers;
        type_00._reader.dataSize = local_280._reader.dataSize;
        type_00._reader.pointerCount = local_280._reader.pointerCount;
        type_00._reader._38_2_ = local_280._reader._38_2_;
        type_00._reader.nestingLimit = local_280._reader.nestingLimit;
        type_00._reader._44_4_ = local_280._reader._44_4_;
        pRVar5 = makeDepSchema(this,type_00,scopeName_03,
                               (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)
                               &slot_1);
        kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe
                  ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot_1);
        local_250 = pRVar5;
        if (pRVar5 != (RawBrandedSchema *)0x0) {
          group = (RawSchema *)
                  kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>
                            ((Vector<capnp::_::RawBrandedSchema::Dependency> *)
                             &node._reader.nestingLimit);
          group->id = 0;
          group->encodedNode = (word *)0x0;
          uVar4 = capnp::_::RawBrandedSchema::makeDepLocation(FIELD,field._reader.nestingLimit);
          *(uint *)&group->id = uVar4;
          group->encodedNode = (word *)local_250;
        }
      }
      else if (WVar3 == GROUP) {
        capnp::schema::Field::Reader::getGroup(&local_320,(Reader *)&dep_1);
        uVar8 = capnp::schema::Field::Group::Reader::getTypeId(&local_320);
        kj::StringPtr::StringPtr((StringPtr *)&_b1578,"(unknown group type)");
        local_2f0 = loadEmpty(this,uVar8,(StringPtr)__b1578,STRUCT,true);
        pAVar6 = kj::_::readMaybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>(bindings);
        if (pAVar6 == (ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)0x0) {
          pRVar5 = getUnbound(this,local_2f0);
          if (pRVar5 != (RawBrandedSchema *)0x0) {
            pDVar9 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>
                               ((Vector<capnp::_::RawBrandedSchema::Dependency> *)
                                &node._reader.nestingLimit);
            *(undefined8 *)pDVar9 = 0;
            pDVar9->schema = (RawBrandedSchema *)0x0;
            uVar4 = capnp::_::RawBrandedSchema::makeDepLocation(FIELD,field._reader.nestingLimit);
            pDVar9->location = uVar4;
            pDVar9->schema = pRVar5;
          }
        }
        else {
          pRVar5 = makeBranded(this,local_2f0,*pAVar6);
          if (pRVar5 != (RawBrandedSchema *)0x0) {
            pDVar9 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>
                               ((Vector<capnp::_::RawBrandedSchema::Dependency> *)
                                &node._reader.nestingLimit);
            *(undefined8 *)pDVar9 = 0;
            pDVar9->schema = (RawBrandedSchema *)0x0;
            uVar4 = capnp::_::RawBrandedSchema::makeDepLocation(FIELD,field._reader.nestingLimit);
            pDVar9->location = uVar4;
            pDVar9->schema = pRVar5;
          }
        }
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end3);
    }
    break;
  case INTERFACE:
    capnp::schema::Node::Reader::getInterface
              ((Reader *)&superclasses.reader.nestingLimit,(Reader *)local_d8);
    capnp::schema::Node::Interface::Reader::getSuperclasses
              ((Reader *)&__range3_1,(Reader *)&superclasses.reader.nestingLimit);
    RVar12 = kj::indices<capnp::List<capnp::schema::Superclass,(capnp::Kind)3>::Reader&>
                       ((Reader *)&__range3_1);
    __begin3_1.value = RVar12.begin_;
    __end3_1 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3_1);
    i_1 = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3_1);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end3_1,(Iterator *)&i_1),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar7 = kj::Range<unsigned_long>::Iterator::operator*(&__end3_1);
      superclass._reader._40_8_ = *puVar7;
      List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)&dep_4,(Reader *)&__range3_1,superclass._reader.nestingLimit);
      uVar8 = capnp::schema::Superclass::Reader::getId((Reader *)&dep_4);
      capnp::schema::Superclass::Reader::getBrand(&local_468,(Reader *)&dep_4);
      local_478 = local_58;
      sStack_470 = sStack_50;
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
                ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot_4,bindings);
      scopeName_02.content.size_ = sStack_470;
      scopeName_02.content.ptr = local_478;
      brand._reader.capTable = local_468._reader.capTable;
      brand._reader.segment = local_468._reader.segment;
      brand._reader.data = local_468._reader.data;
      brand._reader.pointers = local_468._reader.pointers;
      brand._reader.dataSize = local_468._reader.dataSize;
      brand._reader.pointerCount = local_468._reader.pointerCount;
      brand._reader._38_2_ = local_468._reader._38_2_;
      brand._reader.nestingLimit = local_468._reader.nestingLimit;
      brand._reader._44_4_ = local_468._reader._44_4_;
      pRVar5 = makeDepSchema(this,uVar8,INTERFACE,INTERFACE,brand,scopeName_02,
                             (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)
                             &slot_4);
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe
                ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot_4);
      local_438 = pRVar5;
      if (pRVar5 != (RawBrandedSchema *)0x0) {
        methods.reader._40_8_ =
             kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>
                       ((Vector<capnp::_::RawBrandedSchema::Dependency> *)&node._reader.nestingLimit
                       );
        *(undefined8 *)methods.reader._40_8_ = 0;
        ((Dependency *)methods.reader._40_8_)->schema = (RawBrandedSchema *)0x0;
        uVar4 = capnp::_::RawBrandedSchema::makeDepLocation
                          (SUPERCLASS,superclass._reader.nestingLimit);
        *(uint *)methods.reader._40_8_ = uVar4;
        *(RawBrandedSchema **)(methods.reader._40_8_ + 8) = local_438;
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end3_1);
    }
    capnp::schema::Node::Interface::Reader::getMethods
              ((Reader *)&__range3_2,(Reader *)&superclasses.reader.nestingLimit);
    RVar12 = kj::indices<capnp::List<capnp::schema::Method,(capnp::Kind)3>::Reader&>
                       ((Reader *)&__range3_2);
    __begin3_2.value = RVar12.begin_;
    __end3_2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3_2);
    i_2 = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3_2);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end3_2,(Iterator *)&i_2),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar7 = kj::Range<unsigned_long>::Iterator::operator*(&__end3_2);
      method._reader._40_8_ = *puVar7;
      List<capnp::schema::Method,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)&dep_5,(Reader *)&__range3_2,method._reader.nestingLimit);
      uVar8 = capnp::schema::Method::Reader::getParamStructType((Reader *)&dep_5);
      capnp::schema::Method::Reader::getParamBrand(&local_560,(Reader *)&dep_5);
      local_578 = local_58;
      sStack_570 = sStack_50;
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
                ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot_5,bindings);
      scopeName_01.content.size_ = sStack_570;
      scopeName_01.content.ptr = local_578;
      brand_00._reader.capTable = local_560._reader.capTable;
      brand_00._reader.segment = local_560._reader.segment;
      brand_00._reader.data = local_560._reader.data;
      brand_00._reader.pointers = local_560._reader.pointers;
      brand_00._reader.dataSize = local_560._reader.dataSize;
      brand_00._reader.pointerCount = local_560._reader.pointerCount;
      brand_00._reader._38_2_ = local_560._reader._38_2_;
      brand_00._reader.nestingLimit = local_560._reader.nestingLimit;
      brand_00._reader._44_4_ = local_560._reader._44_4_;
      pRVar5 = makeDepSchema(this,uVar8,STRUCT,STRUCT,brand_00,scopeName_01,
                             (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)
                             &slot_5);
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe
                ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot_5);
      local_530 = pRVar5;
      if (pRVar5 != (RawBrandedSchema *)0x0) {
        dep_6 = (RawBrandedSchema *)
                kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>
                          ((Vector<capnp::_::RawBrandedSchema::Dependency> *)
                           &node._reader.nestingLimit);
        dep_6->generic = (RawSchema *)0x0;
        dep_6->scopes = (Scope *)0x0;
        uVar4 = capnp::_::RawBrandedSchema::makeDepLocation
                          (METHOD_PARAMS,method._reader.nestingLimit);
        *(uint *)&dep_6->generic = uVar4;
        dep_6->scopes = (Scope *)local_530;
      }
      uVar8 = capnp::schema::Method::Reader::getResultStructType((Reader *)&dep_5);
      capnp::schema::Method::Reader::getResultBrand(&local_5d0,(Reader *)&dep_5);
      local_5e8 = local_58;
      sStack_5e0 = sStack_50;
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
                ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot_6,bindings);
      scopeName_00.content.size_ = sStack_5e0;
      scopeName_00.content.ptr = local_5e8;
      brand_01._reader.capTable = local_5d0._reader.capTable;
      brand_01._reader.segment = local_5d0._reader.segment;
      brand_01._reader.data = local_5d0._reader.data;
      brand_01._reader.pointers = local_5d0._reader.pointers;
      brand_01._reader.dataSize = local_5d0._reader.dataSize;
      brand_01._reader.pointerCount = local_5d0._reader.pointerCount;
      brand_01._reader._38_2_ = local_5d0._reader._38_2_;
      brand_01._reader.nestingLimit = local_5d0._reader.nestingLimit;
      brand_01._reader._44_4_ = local_5d0._reader._44_4_;
      pRVar5 = makeDepSchema(this,uVar8,STRUCT,STRUCT,brand_01,scopeName_00,
                             (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)
                             &slot_6);
      kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe
                ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot_6);
      local_5a0 = pRVar5;
      if (pRVar5 != (RawBrandedSchema *)0x0) {
        pDVar9 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>
                           ((Vector<capnp::_::RawBrandedSchema::Dependency> *)
                            &node._reader.nestingLimit);
        *(undefined8 *)pDVar9 = 0;
        pDVar9->schema = (RawBrandedSchema *)0x0;
        uVar4 = capnp::_::RawBrandedSchema::makeDepLocation
                          (METHOD_RESULTS,method._reader.nestingLimit);
        pDVar9->location = uVar4;
        pDVar9->schema = local_5a0;
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end3_2);
    }
    break;
  case CONST:
    capnp::schema::Node::Reader::getConst(&local_150,(Reader *)local_d8);
    capnp::schema::Node::Const::Reader::getType(&local_120,&local_150);
    local_168 = local_58;
    sStack_160 = sStack_50;
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
              ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot,bindings);
    scopeName_04.content.size_ = sStack_160;
    scopeName_04.content.ptr = local_168;
    type._reader.capTable = local_120._reader.capTable;
    type._reader.segment = local_120._reader.segment;
    type._reader.data = local_120._reader.data;
    type._reader.pointers = local_120._reader.pointers;
    type._reader.dataSize = local_120._reader.dataSize;
    type._reader.pointerCount = local_120._reader.pointerCount;
    type._reader._38_2_ = local_120._reader._38_2_;
    type._reader.nestingLimit = local_120._reader.nestingLimit;
    type._reader._44_4_ = local_120._reader._44_4_;
    pRVar5 = makeDepSchema(this,type,scopeName_04,
                           (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot);
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe
              ((Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)&slot);
    local_f0 = pRVar5;
    if (pRVar5 != (RawBrandedSchema *)0x0) {
      fields.reader._40_8_ =
           kj::Vector<capnp::_::RawBrandedSchema::Dependency>::add<>
                     ((Vector<capnp::_::RawBrandedSchema::Dependency> *)&node._reader.nestingLimit);
      *(undefined8 *)fields.reader._40_8_ = 0;
      ((Dependency *)fields.reader._40_8_)->schema = (RawBrandedSchema *)0x0;
      uVar4 = capnp::_::RawBrandedSchema::makeDepLocation(CONST_TYPE,0);
      *(uint *)fields.reader._40_8_ = uVar4;
      *(RawBrandedSchema **)(fields.reader._40_8_ + 8) = local_f0;
    }
  }
  pDVar9 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::begin
                     ((Vector<capnp::_::RawBrandedSchema::Dependency> *)&node._reader.nestingLimit);
  pDVar10 = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::end
                      ((Vector<capnp::_::RawBrandedSchema::Dependency> *)&node._reader.nestingLimit)
  ;
  std::
  sort<capnp::_::RawBrandedSchema::Dependency*,capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>
            (pDVar9,pDVar10);
  values = kj::Vector<capnp::_::RawBrandedSchema::Dependency>::asPtr
                     ((Vector<capnp::_::RawBrandedSchema::Dependency> *)&node._reader.nestingLimit);
  AVar13 = copyDeduped<capnp::_::RawBrandedSchema::Dependency>(this,values);
  kj::Vector<capnp::_::RawBrandedSchema::Dependency>::~Vector
            ((Vector<capnp::_::RawBrandedSchema::Dependency> *)&node._reader.nestingLimit);
  return AVar13;
}

Assistant:

kj::ArrayPtr<const _::RawBrandedSchema::Dependency>
SchemaLoader::Impl::makeBrandedDependencies(
    const _::RawSchema* schema,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> bindings) {
  kj::StringPtr scopeName =
      readMessageUnchecked<schema::Node>(schema->encodedNode).getDisplayName();

  kj::Vector<_::RawBrandedSchema::Dependency> deps;

  schema::Node::Reader node = readMessageUnchecked<schema::Node>(schema->encodedNode);

#define ADD_ENTRY(kind, index, make) \
    if (const _::RawBrandedSchema* dep = make) { \
      auto& slot = deps.add(); \
      memset(&slot, 0, sizeof(slot)); \
      slot.location = _::RawBrandedSchema::makeDepLocation( \
        _::RawBrandedSchema::DepKind::kind, index); \
      slot.schema = dep; \
    }

  switch (node.which()) {
    case schema::Node::FILE:
    case schema::Node::ENUM:
    case schema::Node::ANNOTATION:
      break;

    case schema::Node::CONST:
      ADD_ENTRY(CONST_TYPE, 0, makeDepSchema(
          node.getConst().getType(), scopeName, bindings));
      break;

    case schema::Node::STRUCT: {
      auto fields = node.getStruct().getFields();
      for (auto i: kj::indices(fields)) {
        auto field = fields[i];
        switch (field.which()) {
          case schema::Field::SLOT:
            ADD_ENTRY(FIELD, i, makeDepSchema(
                field.getSlot().getType(), scopeName, bindings))
            break;
          case schema::Field::GROUP: {
            const _::RawSchema* group = loadEmpty(
                field.getGroup().getTypeId(),
                "(unknown group type)", schema::Node::STRUCT, true);
            KJ_IF_SOME(b, bindings) {
              ADD_ENTRY(FIELD, i, makeBranded(group, b));
            } else {
              ADD_ENTRY(FIELD, i, getUnbound(group));
            }
            break;
          }
        }
      }
      break;
    }

    case schema::Node::INTERFACE: {
      auto interface = node.getInterface();
      {
        auto superclasses = interface.getSuperclasses();
        for (auto i: kj::indices(superclasses)) {
          auto superclass = superclasses[i];
          ADD_ENTRY(SUPERCLASS, i, makeDepSchema(
              superclass.getId(), schema::Type::INTERFACE, schema::Node::INTERFACE,
              superclass.getBrand(), scopeName, bindings))
        }
      }
      {
        auto methods = interface.getMethods();
        for (auto i: kj::indices(methods)) {
          auto method = methods[i];
          ADD_ENTRY(METHOD_PARAMS, i, makeDepSchema(
              method.getParamStructType(), schema::Type::STRUCT, schema::Node::STRUCT,
              method.getParamBrand(), scopeName, bindings))
          ADD_ENTRY(METHOD_RESULTS, i, makeDepSchema(
              method.getResultStructType(), schema::Type::STRUCT, schema::Node::STRUCT,
              method.getResultBrand(), scopeName, bindings))
        }
      }
      break;
    }
  }